

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadCord
          (EpsCopyInputStream *this,char *ptr,int size,Cord *cord)

{
  int *piVar1;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  int local_38;
  int local_34;
  Cord *local_30;
  Cord *cord_local;
  char *pcStack_20;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_34 = ((int)this->buffer_end_ + 0x10) - (int)ptr;
  local_38 = 0x200;
  local_30 = cord;
  cord_local._4_4_ = size;
  pcStack_20 = ptr;
  ptr_local = (char *)this;
  piVar1 = std::min<int>(&local_34,&local_38);
  if (*piVar1 < size) {
    this_local = (EpsCopyInputStream *)ReadCordFallback(this,pcStack_20,cord_local._4_4_,local_30);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,pcStack_20,(long)cord_local._4_4_);
    absl::lts_20240722::Cord::operator=(local_30,local_48._M_len,local_48._M_str);
    this_local = (EpsCopyInputStream *)(pcStack_20 + cord_local._4_4_);
  }
  return (char *)this_local;
}

Assistant:

PROTOBUF_NODISCARD const char* ReadCord(const char* ptr, int size,
                                          ::absl::Cord* cord) {
    if (size <= std::min<int>(static_cast<int>(buffer_end_ + kSlopBytes - ptr),
                              kMaxCordBytesToCopy)) {
      *cord = absl::string_view(ptr, size);
      return ptr + size;
    }
    return ReadCordFallback(ptr, size, cord);
  }